

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall argparse::Argument::throw_required_arg_no_value_provided_error(Argument *this)

{
  ostream *poVar1;
  runtime_error *this_00;
  string local_1c0 [32];
  stringstream stream;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->m_used_name)._M_str,(this->m_used_name)._M_len);
  std::operator<<(poVar1,": no value provided.");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_required_arg_no_value_provided_error() const {
    std::stringstream stream;
    stream << m_used_name << ": no value provided.";
    throw std::runtime_error(stream.str());
  }